

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oprom_parser.c
# Opt level: O2

int image_oprom_get_device(igsc_oprom_image *img,uint32_t num,oprom_subsystem_device_id *device)

{
  long lVar1;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  igsc_log_func_t p_Var5;
  char *pcVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  char __time_buf [128];
  
  uVar7 = (ulong)num;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = image_oprom_count_devices(img);
  uVar3 = igsc_get_log_level();
  if (uVar3 != 0) {
    p_Var5 = igsc_get_log_callback_func();
    if (p_Var5 == (igsc_log_func_t)0x0) {
      pcVar6 = gsc_time(__time_buf,0x80);
      syslog(7,"%s: IGSC: (%s:%s():%d) max_num %u num %u\n",pcVar6,
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/oprom_parser.c",
             "image_oprom_get_device",0x319,(ulong)uVar2,uVar7);
    }
    else {
      p_Var5 = igsc_get_log_callback_func();
      pcVar6 = gsc_time(__time_buf,0x80);
      (*p_Var5)(IGSC_LOG_LEVEL_DEBUG,"%s: IGSC: (%s:%s():%d) max_num %u num %u\n",pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/oprom_parser.c",
                "image_oprom_get_device",0x319,(ulong)uVar2,uVar7);
    }
  }
  if (num < uVar2) {
    gsc_memcpy_s(device,4,&(img->cpd_img).dev_ext[1].extension_type + uVar7,4);
    iVar4 = 0;
  }
  else {
    iVar4 = 4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

int image_oprom_get_device(struct igsc_oprom_image *img, uint32_t num,
                           struct oprom_subsystem_device_id *device)
{
    uint32_t max_num = image_oprom_count_devices(img);

    gsc_debug("max_num %u num %u\n", max_num, num);
    if (num < max_num)
    {
        gsc_memcpy_s(device, sizeof(*device),
                     &img->cpd_img.dev_ext->device_ids[num],
                     sizeof(*device));
        return IGSC_SUCCESS;
    }

    return IGSC_ERROR_DEVICE_NOT_FOUND;
}